

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

value * __thiscall
mjs::anon_unknown_46::json_str
          (value *__return_storage_ptr__,anon_unknown_46 *this,stringify_state *state,
          wstring_view key,object_ptr *holder)

{
  pointer pvVar1;
  gc_heap *pgVar2;
  gc_heap *this_00;
  bool bVar3;
  uint32_t uVar4;
  undefined8 *puVar5;
  object *poVar6;
  long *plVar7;
  void *pvVar8;
  gc_table *pgVar9;
  uint *puVar10;
  wstring *pwVar11;
  value *extraout_RAX;
  wstring_view *s_00;
  char *pcVar12;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  undefined8 extraout_RDX_00;
  wstring_view *s_01;
  string *s;
  long lVar14;
  undefined1 this_01 [8];
  ulong uVar15;
  wchar_t *pwVar16;
  undefined8 uVar17;
  pointer pvVar18;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *this_02;
  gc_heap_ptr_untyped *pgVar19;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s_1;
  pointer pbVar20;
  uint uVar21;
  mjs *this_03;
  undefined8 this_04;
  wstring_view key_00;
  wstring_view key_01;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o_2;
  vector<mjs::string,_std::allocator<mjs::string>_> partial;
  object_ptr o;
  value to_json_value;
  object_ptr o_1;
  value v;
  object_ptr to_json;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  partial_1;
  vector<mjs::string,_std::allocator<mjs::string>_> k;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_220;
  undefined1 local_208 [8];
  undefined1 local_200 [32];
  value *local_1e0;
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [32];
  gc_heap_ptr_untyped local_1b0;
  gc_heap_ptr_untyped local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_190;
  undefined1 local_180 [8];
  undefined1 local_178 [32];
  value local_158;
  undefined1 local_130 [32];
  gc_heap_ptr_untyped local_110;
  undefined1 local_100 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_c8;
  gc_heap *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  pointer local_88;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_78;
  undefined8 local_68;
  gc_table *local_58;
  wstring_view local_50;
  ulong local_40;
  uint *local_38;
  
  pgVar19 = (gc_heap_ptr_untyped *)key._M_str;
  local_50._M_str = (wchar_t *)key._M_len;
  pgVar2 = *(gc_heap **)this;
  local_1e0 = __return_storage_ptr__;
  local_50._M_len = (size_t)state;
  puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(pgVar19);
  (**(code **)*puVar5)(local_100,puVar5,&local_50);
  if (local_100._0_4_ == object) {
    local_130._0_8_ = CONCAT71(local_f8._1_7_,local_f8.b_);
    local_130._8_4_ = local_f8.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    if ((gc_heap *)local_130._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_130._0_8_,(gc_heap_ptr_untyped *)local_130);
    }
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_130);
    local_208 = (undefined1  [8])0x6;
    local_200._0_8_ = L"toJSON";
    (**(code **)*puVar5)(local_180,puVar5);
    if (local_180._0_4_ == object) {
      local_d8._0_8_ = local_178._0_8_;
      local_d8._8_4_ = local_178._8_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_178._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)0x0) {
        gc_heap::attach((gc_heap *)local_178._0_8_,(gc_heap_ptr_untyped *)local_d8);
      }
      bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>((gc_heap_ptr_untyped *)local_d8);
      if (bVar3) {
        string::string((string *)&local_1a0,pgVar2,&local_50);
        local_230._0_4_ = 4;
        local_230._8_8_ = local_1a0.heap_;
        local_220._M_local_buf[0] = local_1a0.pos_;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1a0.heap_ !=
            (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)0x0) {
          gc_heap::attach(local_1a0.heap_,(gc_heap_ptr_untyped *)(local_230 + 8));
        }
        __l._M_len = 1;
        __l._M_array = (iterator)local_230;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_1d8,__l,
                   (allocator_type *)&local_b8);
        call_function((value *)local_208,(value *)local_180,(value *)local_100,
                      (vector<mjs::value,_std::allocator<mjs::value>_> *)local_1d8);
        value::operator=((value *)local_100,(value *)local_208);
        value::destroy((value *)local_208);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_1d8);
        value::destroy((value *)local_230);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1a0);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_d8);
    }
    value::destroy((value *)local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_130);
  }
  local_d8._0_8_ = local_50._M_len;
  local_d8._8_8_ = local_50._M_str;
  if (*(long *)(this + 0x20) != 0) {
    bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>
                      ((gc_heap_ptr_untyped *)(this + 0x20));
    if (!bVar3) {
      __assert_fail("replacer_.has_type<function_object>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x20f,
                    "void mjs::(anonymous namespace)::stringify_state::call_replacer(value &, const std::wstring_view, const object_ptr &)"
                   );
    }
    local_230._0_4_ = 5;
    local_230._8_8_ = *(undefined8 *)(this + 0x20);
    local_220._M_local_buf[0] = *(undefined4 *)(this + 0x28);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_230._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)0x0) {
      gc_heap::attach((gc_heap *)local_230._8_8_,(gc_heap_ptr_untyped *)(local_230 + 8));
    }
    local_1d8._0_4_ = 5;
    this_00 = pgVar19->heap_;
    auStack_1d0._0_8_ = this_00;
    auStack_1d0._8_4_ = pgVar19->pos_;
    if (this_00 != (gc_heap *)0x0) {
      gc_heap::attach(this_00,(gc_heap_ptr_untyped *)(local_1d8 + 8));
    }
    string::string((string *)&local_1a0,*(gc_heap **)this,(wstring_view *)local_d8);
    local_180._0_4_ = string;
    local_178._0_8_ = local_1a0.heap_;
    local_178._8_4_ = local_1a0.pos_;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a0.heap_ !=
        (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)0x0) {
      gc_heap::attach(local_1a0.heap_,(gc_heap_ptr_untyped *)local_178);
    }
    value::value(&local_158,(value *)local_100);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_180;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_130,__l_00,
               (allocator_type *)&local_b8);
    call_function((value *)local_208,(value *)local_230,(value *)local_1d8,
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)local_130);
    value::operator=((value *)local_100,(value *)local_208);
    value::destroy((value *)local_208);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_130);
    lVar14 = 0x28;
    do {
      value::destroy((value *)(local_180 + lVar14));
      lVar14 = lVar14 + -0x28;
    } while (lVar14 != -0x28);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1a0);
    value::destroy((value *)local_1d8);
    value::destroy((value *)local_230);
  }
  if (local_100._0_4_ == object) {
    local_208 = (undefined1  [8])CONCAT71(local_f8._1_7_,local_f8.b_);
    local_200._0_4_ = local_f8.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    if (local_208 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_208,(gc_heap_ptr_untyped *)local_208);
    }
    poVar6 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_208);
    bVar3 = is_primitive_object(poVar6);
    if (bVar3) {
      plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_208);
      (**(code **)(*plVar7 + 0x20))(local_180,plVar7);
      value::operator=((value *)local_100,(value *)local_180);
      value::destroy((value *)local_180);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
  }
  switch(local_100._0_4_) {
  case 0:
    value::value(local_1e0,(value *)&value::undefined);
    goto LAB_0014714d;
  case 1:
    plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    (**(code **)(*plVar7 + 0x98))(local_180,plVar7,"null");
    local_1e0->type_ = string;
    pgVar2 = (gc_heap *)CONCAT44(local_180._4_4_,local_180._0_4_);
    (local_1e0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         pgVar2;
    *(undefined4 *)((long)&local_1e0->field_1 + 8) = local_178._0_4_;
    if (pgVar2 != (gc_heap *)0x0) {
      gc_heap::attach(pgVar2,(gc_heap_ptr_untyped *)&(local_1e0->field_1).s_);
    }
    break;
  case 2:
    plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    pcVar12 = "false";
    if (local_f8.b_ != false) {
      pcVar12 = "true";
    }
    (**(code **)(*plVar7 + 0x98))(local_180,plVar7,pcVar12);
    local_1e0->type_ = string;
    pgVar2 = (gc_heap *)CONCAT44(local_180._4_4_,local_180._0_4_);
    (local_1e0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         pgVar2;
    *(undefined4 *)((long)&local_1e0->field_1 + 8) = local_178._0_4_;
    if (pgVar2 != (gc_heap *)0x0) {
      gc_heap::attach(pgVar2,(gc_heap_ptr_untyped *)&(local_1e0->field_1).s_);
    }
    break;
  case 3:
    if ((ulong)ABS((double)CONCAT71(local_f8._1_7_,local_f8.b_)) < 0x7ff0000000000000) {
      to_string((mjs *)local_180,pgVar2,(double)CONCAT71(local_f8._1_7_,local_f8.b_));
      local_1e0->type_ = string;
      pgVar2 = (gc_heap *)CONCAT44(local_180._4_4_,local_180._0_4_);
      (local_1e0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           pgVar2;
      *(undefined4 *)((long)&local_1e0->field_1 + 8) = local_178._0_4_;
      if (pgVar2 != (gc_heap *)0x0) {
        gc_heap::attach(pgVar2,(gc_heap_ptr_untyped *)&(local_1e0->field_1).s_);
      }
    }
    else {
      plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
      (**(code **)(*plVar7 + 0x98))(local_180,plVar7,"null");
      local_1e0->type_ = string;
      pgVar2 = (gc_heap *)CONCAT44(local_180._4_4_,local_180._0_4_);
      (local_1e0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           pgVar2;
      *(undefined4 *)((long)&local_1e0->field_1 + 8) = local_178._0_4_;
      if (pgVar2 != (gc_heap *)0x0) {
        gc_heap::attach(pgVar2,(gc_heap_ptr_untyped *)&(local_1e0->field_1).s_);
      }
    }
    break;
  case 4:
    puVar10 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_100 + 8));
    local_1d8._4_4_ = 0;
    local_1d8._0_4_ = *puVar10;
    auStack_1d0._0_8_ = puVar10 + 1;
    (anonymous_namespace)::json_quote_abi_cxx11_
              ((wstring *)local_180,(_anonymous_namespace_ *)local_1d8,s_00);
    local_230._8_8_ = CONCAT44(local_180._4_4_,local_180._0_4_);
    local_230._0_8_ = local_178._0_8_;
    string::string((string *)local_208,pgVar2,(wstring_view *)local_230);
    local_1e0->type_ = string;
    (local_1e0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_208;
    *(undefined4 *)((long)&local_1e0->field_1 + 8) = local_200._0_4_;
    if (local_208 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_208,(gc_heap_ptr_untyped *)&(local_1e0->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
    if ((undefined1 *)CONCAT44(local_180._4_4_,local_180._0_4_) != local_178 + 8) {
      operator_delete((undefined1 *)CONCAT44(local_180._4_4_,local_180._0_4_),
                      CONCAT44(local_178._12_4_,local_178._8_4_) * 4 + 4);
    }
    goto LAB_0014714d;
  case 5:
    local_1b0.pos_ = local_f8.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    if ((gc_heap *)CONCAT71(local_f8._1_7_,local_f8.b_) != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)CONCAT71(local_f8._1_7_,local_f8.b_),&local_1b0);
    }
    bVar3 = gc_heap_ptr_untyped::has_type<mjs::function_object>(&local_1b0);
    if (bVar3) {
      value::value(local_1e0,(value *)&value::undefined);
    }
    else {
      bVar3 = is_array((object_ptr *)&local_1b0);
      if (bVar3) {
        stringify_state::nest::nest
                  ((nest *)local_180,(stringify_state *)this,(object_ptr *)&local_1b0);
        _local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                      )0x0;
        auStack_1d0._8_8_ = (pointer)0x0;
        puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1b0);
        local_230._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
              *)0x6;
        local_230._8_8_ = L"length";
        (**(code **)*puVar5)(local_208,puVar5);
        uVar4 = to_uint32((value *)local_208);
        value::destroy((value *)local_208);
        if (uVar4 != 0) {
          this_03 = (mjs *)0x0;
          uVar13 = extraout_RDX;
          do {
            index_string_abi_cxx11_((wstring *)local_230,this_03,(uint32_t)uVar13);
            key_00._M_str = (wchar_t *)&local_1b0;
            key_00._M_len = local_230._0_8_;
            json_str((value *)local_208,this,(stringify_state *)local_230._8_8_,key_00,holder);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_230._0_8_ != &local_220) {
              operator_delete((void *)local_230._0_8_,
                              CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4 + 4)
              ;
            }
            if (local_208._0_4_ == L'\x04') {
              std::vector<mjs::string,_std::allocator<mjs::string>_>::push_back
                        ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1d8,
                         (value_type *)local_200);
            }
            else {
              if (local_208._0_4_ != L'\0') {
                __assert_fail("str_p.type() == value_type::string",
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                              ,0x288,
                              "string mjs::(anonymous namespace)::json_str_array(stringify_state &, const object_ptr &)"
                             );
              }
              plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
              (**(code **)(*plVar7 + 0x98))((wstring *)local_230,plVar7,"null");
              std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                        ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1d8,
                         (string *)local_230);
              gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_230);
            }
            value::destroy((value *)local_208);
            uVar21 = (int)this_03 + 1;
            this_03 = (mjs *)(ulong)uVar21;
            uVar13 = extraout_RDX_00;
          } while (uVar4 != uVar21);
        }
        if (local_1d8 == (undefined1  [8])auStack_1d0._0_8_) {
          plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
          (**(code **)(*plVar7 + 0x98))(&local_110,plVar7,"[]");
        }
        else {
          local_208 = (undefined1  [8])(local_200 + 8);
          local_200._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                *)0x0;
          local_200._8_4_ = 0;
          std::__cxx11::wstring::push_back((wchar_t)local_208);
          (anonymous_namespace)::stringify_state::nest::start_gap_abi_cxx11_
                    ((wstring *)local_230,(void *)CONCAT44(local_180._4_4_,local_180._0_4_));
          std::__cxx11::wstring::_M_append((wchar_t *)local_208,local_230._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_230._0_8_ != &local_220) {
            operator_delete((void *)local_230._0_8_,
                            CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4 + 4);
          }
          uVar13 = auStack_1d0._0_8_;
          if (local_1d8 != (undefined1  [8])auStack_1d0._0_8_) {
            bVar3 = true;
            this_01 = local_1d8;
            do {
              if (!bVar3) {
                (anonymous_namespace)::stringify_state::nest::sep_abi_cxx11_
                          ((wstring *)local_230,(void *)CONCAT44(local_180._4_4_,local_180._0_4_));
                std::__cxx11::wstring::_M_append((wchar_t *)local_208,local_230._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_230._0_8_ != &local_220) {
                  operator_delete((void *)local_230._0_8_,
                                  CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4
                                  + 4);
                }
              }
              pvVar8 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
              std::__cxx11::wstring::append((wchar_t *)local_208,(long)pvVar8 + 4);
              this_01 = (undefined1  [8])&((gc_heap *)this_01)->alloc_context_;
              bVar3 = false;
            } while (this_01 != (undefined1  [8])uVar13);
          }
          (anonymous_namespace)::stringify_state::nest::end_gap_abi_cxx11_
                    ((wstring *)local_230,local_180);
          std::__cxx11::wstring::_M_append((wchar_t *)local_208,local_230._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_230._0_8_ != &local_220) {
            operator_delete((void *)local_230._0_8_,
                            CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4 + 4);
          }
          std::__cxx11::wstring::push_back((wchar_t)local_208);
          local_230._0_8_ = local_200._0_8_;
          local_230._8_8_ = local_208;
          string::string((string *)&local_110,*(gc_heap **)this,(wstring_view *)local_230);
          if (local_208 != (undefined1  [8])(local_200 + 8)) {
            operator_delete((void *)local_208,CONCAT44(local_200._12_4_,local_200._8_4_) * 4 + 4);
          }
        }
        this_02 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_1d8;
      }
      else {
        stringify_state::nest::nest
                  ((nest *)local_180,(stringify_state *)this,(object_ptr *)&local_1b0);
        if (*(long *)(this + 0x30) == 0) {
          poVar6 = (object *)gc_heap_ptr_untyped::get(&local_1b0);
          object::own_property_names
                    ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_78,poVar6,true);
        }
        else {
          local_78 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                      )0x0;
          local_68 = 0;
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(this + 0x30));
          local_58 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::gc_table,_true>
                     ::dereference((gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::gc_table,_true>
                                    *)(puVar5 + 1),(gc_heap *)*puVar5);
          uVar13 = *(undefined8 *)this;
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(this + 0x30));
          pgVar9 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::gc_table,_true>
                   ::dereference((gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::gc_table,_true>
                                  *)(puVar5 + 1),(gc_heap *)*puVar5);
          uVar21 = pgVar9->length_;
          if ((ulong)uVar21 != 0) {
            uVar15 = 0;
            do {
              gc_heap::unsafe_create_from_position<mjs::gc_string>
                        ((gc_heap *)local_230,(uint32_t)uVar13);
              local_208 = (undefined1  [8])local_230._0_8_;
              local_200._0_4_ = local_230._8_4_;
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_230._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)0x0) {
                gc_heap::attach((gc_heap *)local_230._0_8_,(gc_heap_ptr_untyped *)local_208);
              }
              std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                        ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_78,
                         (string *)local_208);
              gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
              gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_230);
              uVar15 = uVar15 + 1;
            } while (uVar21 != uVar15);
          }
        }
        local_98 = (undefined1  [16])0x0;
        local_88 = (pointer)0x0;
        uVar13 = local_78._8_8_;
        if (local_78._M_allocated_capacity == local_78._8_8_) {
LAB_00147090:
          plVar7 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
          (**(code **)(*plVar7 + 0x98))(&local_110,plVar7,"{}");
        }
        else {
          this_04 = local_78._M_allocated_capacity;
          do {
            puVar10 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_04);
            key_01._M_len = puVar10 + 1;
            key_01._M_str = (wchar_t *)&local_1b0;
            json_str((value *)local_208,this,(stringify_state *)(ulong)*puVar10,key_01,holder);
            if (local_208._0_4_ != L'\0') {
              if (local_208._0_4_ != L'\x04') {
                __assert_fail("str_p.type() == value_type::string",
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                              ,0x265,
                              "string mjs::(anonymous namespace)::json_str_object(stringify_state &, const object_ptr &)"
                             );
              }
              puVar10 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_04);
              local_38 = puVar10 + 1;
              local_40 = (ulong)*puVar10;
              (anonymous_namespace)::json_quote_abi_cxx11_
                        ((wstring *)local_d8,(_anonymous_namespace_ *)&local_40,s_01);
              pwVar11 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_d8);
              std::__cxx11::wstring::wstring((wstring *)local_130,pwVar11);
              bVar3 = *(long *)(CONCAT44(local_180._4_4_,local_180._0_4_) + 0x68) != 0;
              pwVar16 = L"";
              if (bVar3) {
                pwVar16 = L" ";
              }
              local_1a0.heap_ = (gc_heap *)&local_190;
              std::__cxx11::wstring::_M_construct<wchar_t_const*>
                        ((wstring *)&local_1a0,pwVar16,pwVar16 + bVar3);
              pvVar18 = (pointer)0x3;
              if ((gc_heap *)local_130._0_8_ != (gc_heap *)(local_130 + 0x10)) {
                pvVar18 = (pointer)local_130._16_8_;
              }
              pvVar1 = (pointer)(CONCAT44(local_1a0._12_4_,local_1a0.pos_) +
                                CONCAT44(local_130._12_4_,local_130._8_4_));
              if (pvVar18 < pvVar1) {
                holder = (object_ptr *)&local_190;
                uVar17 = (pointer)0x3;
                if (local_1a0.heap_ != (gc_heap *)holder) {
                  uVar17 = local_190._M_allocated_capacity;
                }
                if ((ulong)uVar17 < pvVar1) goto LAB_00146d02;
                pwVar11 = (wstring *)
                          std::__cxx11::wstring::replace
                                    ((ulong)&local_1a0,0,(wchar_t *)0x0,local_130._0_8_);
              }
              else {
LAB_00146d02:
                pwVar11 = (wstring *)
                          std::__cxx11::wstring::_M_append
                                    ((wchar_t *)local_130,(ulong)local_1a0.heap_);
              }
              std::__cxx11::wstring::wstring((wstring *)local_1d8,pwVar11);
              if (local_208._0_4_ != L'\x04') {
                __assert_fail("type_ == value_type::string",
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                              ,0x45,"const string &mjs::value::string_value() const");
              }
              puVar10 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_200);
              local_b8 = (gc_heap *)local_a8;
              std::__cxx11::wstring::_M_construct<wchar_t_const*>
                        ((wstring *)&local_b8,puVar10 + 1,puVar10 + (ulong)*puVar10 + 1);
              pvVar18 = (pointer)0x3;
              if (local_1d8 != (undefined1  [8])(auStack_1d0 + 8)) {
                pvVar18 = (pointer)auStack_1d0._8_8_;
              }
              pvVar1 = (pointer)((long)&((pointer_set *)auStack_1d0._0_8_)->set_ + local_b0);
              if (pvVar18 < pvVar1) {
                pvVar18 = (pointer)0x3;
                if (local_b8 != (gc_heap *)local_a8) {
                  pvVar18 = (pointer)local_a8._0_8_;
                }
                if (pvVar18 < pvVar1) goto LAB_00146db8;
                pwVar11 = (wstring *)
                          std::__cxx11::wstring::replace
                                    ((ulong)&local_b8,0,(wchar_t *)0x0,(ulong)local_1d8);
              }
              else {
LAB_00146db8:
                pwVar11 = (wstring *)
                          std::__cxx11::wstring::_M_append((wchar_t *)local_1d8,(ulong)local_b8);
              }
              std::__cxx11::wstring::wstring((wstring *)local_230,pwVar11);
              std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
              emplace_back<std::__cxx11::wstring>
                        ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                         local_98,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)local_230);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_230._0_8_ != &local_220) {
                operator_delete((void *)local_230._0_8_,
                                CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4 +
                                4);
              }
              if (local_b8 != (gc_heap *)local_a8) {
                operator_delete(local_b8,local_a8._0_8_ * 4 + 4);
              }
              if (local_1d8 != (undefined1  [8])(auStack_1d0 + 8)) {
                operator_delete((void *)local_1d8,auStack_1d0._8_8_ * 4 + 4);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_1a0.heap_ != &local_190) {
                operator_delete(local_1a0.heap_,local_190._M_allocated_capacity * 4 + 4);
              }
              if ((gc_heap *)local_130._0_8_ != (gc_heap *)(local_130 + 0x10)) {
                operator_delete((void *)local_130._0_8_,local_130._16_8_ * 4 + 4);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_d8._0_8_ != &local_c8) {
                operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity * 4 + 4);
              }
            }
            value::destroy((value *)local_208);
            this_04 = this_04 + 0x10;
          } while (this_04 != uVar13);
          if (local_98._0_8_ == local_98._8_8_) goto LAB_00147090;
          local_200._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                *)0x0;
          local_200._8_4_ = 0;
          local_208 = (undefined1  [8])(local_200 + 8);
          std::__cxx11::wstring::push_back((wchar_t)local_208);
          (anonymous_namespace)::stringify_state::nest::start_gap_abi_cxx11_
                    ((wstring *)local_230,(void *)CONCAT44(local_180._4_4_,local_180._0_4_));
          std::__cxx11::wstring::_M_append((wchar_t *)local_208,local_230._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_230._0_8_ != &local_220) {
            operator_delete((void *)local_230._0_8_,
                            CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4 + 4);
          }
          uVar13 = local_98._8_8_;
          if (local_98._0_8_ != local_98._8_8_) {
            bVar3 = true;
            pbVar20 = (pointer)local_98._0_8_;
            do {
              if (!bVar3) {
                (anonymous_namespace)::stringify_state::nest::sep_abi_cxx11_
                          ((wstring *)local_230,(void *)CONCAT44(local_180._4_4_,local_180._0_4_));
                std::__cxx11::wstring::_M_append((wchar_t *)local_208,local_230._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_230._0_8_ != &local_220) {
                  operator_delete((void *)local_230._0_8_,
                                  CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4
                                  + 4);
                }
              }
              std::__cxx11::wstring::_M_append
                        ((wchar_t *)local_208,(ulong)(pbVar20->_M_dataplus)._M_p);
              pbVar20 = pbVar20 + 1;
              bVar3 = false;
            } while (pbVar20 != (pointer)uVar13);
          }
          (anonymous_namespace)::stringify_state::nest::end_gap_abi_cxx11_
                    ((wstring *)local_230,local_180);
          std::__cxx11::wstring::_M_append((wchar_t *)local_208,local_230._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_230._0_8_ != &local_220) {
            operator_delete((void *)local_230._0_8_,
                            CONCAT44(local_220._M_local_buf[1],local_220._M_local_buf[0]) * 4 + 4);
          }
          std::__cxx11::wstring::push_back((wchar_t)local_208);
          local_230._0_8_ = local_200._0_8_;
          local_230._8_8_ = local_208;
          string::string((string *)&local_110,*(gc_heap **)this,(wstring_view *)local_230);
          if (local_208 != (undefined1  [8])(local_200 + 8)) {
            operator_delete((void *)local_208,CONCAT44(local_200._12_4_,local_200._8_4_) * 4 + 4);
          }
        }
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_98);
        this_02 = &local_78;
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)this_02);
      stringify_state::nest::~nest((nest *)local_180);
      local_1e0->type_ = string;
      (local_1e0->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           local_110.heap_;
      *(uint32_t *)((long)&local_1e0->field_1 + 8) = local_110.pos_;
      if (local_110.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_110.heap_,(gc_heap_ptr_untyped *)&(local_1e0->field_1).s_);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
    }
    pgVar19 = &local_1b0;
    goto LAB_00147148;
  default:
    __assert_fail("v.type() == value_type::object",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                  ,0x2d0,
                  "value mjs::(anonymous namespace)::json_str(stringify_state &, const std::wstring_view, const object_ptr &)"
                 );
  }
  pgVar19 = (gc_heap_ptr_untyped *)local_180;
LAB_00147148:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar19);
LAB_0014714d:
  value::destroy((value *)local_100);
  return extraout_RAX;
}

Assistant:

value json_str(stringify_state& state, const std::wstring_view key, const object_ptr& holder) {
    // ES5.1, 15.12.3 Str(key, holder)
    // May only return a string or undefined

    auto& h = state.heap();
    // 1. Let value be the result of calling the [[Get]] internal method of holder with argument key.
    auto v = holder->get(key);

    // 2. If Type(value) is Object, then
    if (v.type() == value_type::object) {        
        auto o = v.object_value();
        auto to_json_value = o->get(L"toJSON");
        if (to_json_value.type() == value_type::object) {
            if (auto to_json = to_json_value.object_value(); to_json.has_type<function_object>()) {
                v = call_function(to_json_value, v, {value{string{h,key}}});
            }
        }
    }

    // 3. If ReplacerFunction is not undefined, then
    state.call_replacer(v, key, holder);

    // 4. If Type(value) is Object then, 
    if (v.type() == value_type::object) {        
        if (auto o = v.object_value(); is_primitive_object(*o)) {
            v = o->internal_value();
        }
    }

    switch (v.type()) {
    case value_type::undefined:
        return value::undefined;
    case value_type::null:
        return value{state.null_str()};
    case value_type::boolean:
        return value{state.bool_str(v.boolean_value())};
    case value_type::number:
        if (!std::isfinite(v.number_value())) {
            return value{state.null_str()};
        } else {
            return value{to_string(h, v.number_value())};
        }
    case value_type::string:
        return value{string{h, json_quote(v.string_value().view())}};
    default:
        break;
    }
    assert(v.type() == value_type::object);
    const auto o = v.object_value();
    if (o.has_type<function_object>()) {
        return value::undefined;
    } else {
        return value{is_array(o) ? json_str_array(state, o) : json_str_object(state, o) };
    }
}